

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v7::detail::
     handle_cstring_type_spec<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *paVar1;
  buffer_appender<char> bVar2;
  size_t in_RCX;
  void *in_RDX;
  int iVar3;
  undefined7 in_register_00000039;
  
  iVar3 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar3 != 0x73) {
    if (iVar3 == 0x70) {
      paVar1 = handler->formatter;
      bVar2 = write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                        ((buffer_appender<char>)
                         (paVar1->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container,(unsigned_long)handler->value,paVar1->specs_);
      (paVar1->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      return;
    }
    if (iVar3 != 0) {
      error_handler::on_error((error_handler *)handler,"invalid type specifier");
    }
  }
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
  write(handler->formatter,(int)handler->value,in_RDX,in_RCX);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}